

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::Board(Board *this,BoardSize size,BoardMode mode)

{
  mapped_type mVar1;
  pointer puVar2;
  pointer puVar3;
  mapped_type *pmVar4;
  long lVar5;
  unsigned_long uVar6;
  BoardSize local_1c;
  
  this->size = size;
  local_1c = size;
  pmVar4 = std::
           map<BoardSize,_unsigned_long,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_unsigned_long>_>_>
           ::at(&Maps::boardSizeInt,&local_1c);
  mVar1 = *pmVar4;
  this->sizeInt = mVar1;
  this->mode = mode;
  this->nullValue = mVar1 * mVar1 - 1;
  (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->values,mVar1 * mVar1);
  puVar2 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = 0;
  for (lVar5 = 0; (pointer)((long)puVar2 + lVar5) != puVar3; lVar5 = lVar5 + 8) {
    puVar2[uVar6] = uVar6;
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

Board::Board( BoardSize size, BoardMode mode ) : size( size ),
                                                 mode( mode ),
                                                 sizeInt( Maps::boardSizeInt.at( size )),
                                                 nullValue( sizeInt * sizeInt - 1 )
{
    values.resize( sizeInt * sizeInt );
    std::iota( values.begin(), values.end(), 0 );
}